

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

bool __thiscall
slang::ast::ValueExpressionBase::requireLValueImpl
          (ValueExpressionBase *this,ASTContext *context,SourceLocation location,
          bitmask<slang::ast::AssignFlags> flags,Expression *longestStaticPrefix,
          EvalContext *customEvalContext)

{
  SourceRange varRange;
  bool bVar1;
  uint uVar2;
  SourceLocation in_RAX;
  Diagnostic *pDVar4;
  Type *this_00;
  NetSymbol *pNVar5;
  VariableSymbol *context_00;
  ModportPortSymbol *pMVar6;
  SourceLocation SVar7;
  SourceLocation unaff_RBX;
  DiagCode code;
  ValueSymbol *this_01;
  SourceRange sourceRange;
  SymbolKind SVar3;
  SourceLocation SVar8;
  
  SVar8 = (this->super_Expression).sourceRange.startLoc;
  if (((ulong)location & 0xfffffff) == 0) {
    location = SVar8;
  }
  this_01 = this->symbol;
  SVar3 = (this_01->super_Symbol).kind;
  if ((SVar3 - EnumValue < 0x3f) &&
     ((0x4000000008000001U >> ((ulong)(SVar3 - EnumValue) & 0x3f) & 1) != 0)) {
    pDVar4 = ASTContext::addDiag(context,(DiagCode)0x340007,location);
    pDVar4 = Diagnostic::operator<<(pDVar4,(this->symbol->super_Symbol).name);
    Diagnostic::addNote(pDVar4,(DiagCode)0x40001,(this->symbol->super_Symbol).location);
    Diagnostic::operator<<(pDVar4,(this->super_Expression).sourceRange);
    return false;
  }
  if (((context->flags).m_bits & 0x80) == 0) {
    if (SVar3 == Net) {
      SVar7 = (this->super_Expression).sourceRange.endLoc;
      code.subsystem = Expressions;
      code.code = 10;
LAB_0031663f:
      sourceRange.endLoc = SVar7;
      sourceRange.startLoc = SVar8;
      ASTContext::addDiag(context,code,sourceRange);
      return false;
    }
  }
  else {
    this_00 = DeclaredType::getType(&this_01->declaredType);
    bVar1 = Type::isCHandle(this_00);
    if (bVar1) {
      SVar8 = (this->super_Expression).sourceRange.startLoc;
      SVar7 = (this->super_Expression).sourceRange.endLoc;
      code.subsystem = Expressions;
      code.code = 9;
      goto LAB_0031663f;
    }
    this_01 = this->symbol;
    SVar3 = (this_01->super_Symbol).kind;
    if (SVar3 == Net) {
      pNVar5 = Symbol::as<slang::ast::NetSymbol>(&this_01->super_Symbol);
      if ((pNVar5->netType->netKind == UWire & (byte)((flags.m_bits & 0x10) >> 4)) != 0) {
        pDVar4 = ASTContext::addDiag(context,(DiagCode)0x4e0007,(this->super_Expression).sourceRange
                                    );
        Diagnostic::operator<<(pDVar4,(this->symbol->super_Symbol).name);
        return false;
      }
      this_01 = this->symbol;
      SVar3 = (this_01->super_Symbol).kind;
    }
  }
  uVar2 = SVar3 - ModportPort;
  if (uVar2 < 0x28) {
    if ((0xc006078000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      if (((ulong)uVar2 == 0) &&
         (pMVar6 = Symbol::as<slang::ast::ModportPortSymbol>(&this_01->super_Symbol),
         pMVar6->direction == In)) {
        pDVar4 = ASTContext::addDiag(context,(DiagCode)0x520007,(this->super_Expression).sourceRange
                                    );
        Diagnostic::operator<<(pDVar4,(this->symbol->super_Symbol).name);
        Diagnostic::addNote(pDVar4,(DiagCode)0x40001,(this->symbol->super_Symbol).location);
        return false;
      }
    }
    else {
      context_00 = Symbol::as<slang::ast::VariableSymbol>(&this_01->super_Symbol);
      varRange.endLoc = unaff_RBX;
      varRange.startLoc = in_RAX;
      bVar1 = checkVariableAssignment
                        ((ValueExpressionBase *)context,(ASTContext *)context_00,
                         (VariableSymbol *)(ulong)flags.m_bits,
                         (bitmask<slang::ast::AssignFlags>)location._0_4_,
                         (this->super_Expression).sourceRange.startLoc,varRange);
      if (!bVar1) {
        return false;
      }
    }
  }
  if (longestStaticPrefix == (Expression *)0x0) {
    longestStaticPrefix = &this->super_Expression;
  }
  ASTContext::addDriver(context,this->symbol,longestStaticPrefix,flags,customEvalContext);
  return true;
}

Assistant:

bool ValueExpressionBase::requireLValueImpl(const ASTContext& context, SourceLocation location,
                                            bitmask<AssignFlags> flags,
                                            const Expression* longestStaticPrefix,
                                            EvalContext* customEvalContext) const {
    if (!location)
        location = sourceRange.start();

    if (symbol.kind == SymbolKind::Parameter || symbol.kind == SymbolKind::EnumValue ||
        symbol.kind == SymbolKind::Specparam) {
        auto& diag = context.addDiag(diag::CantModifyConst, location) << symbol.name;
        diag.addNote(diag::NoteDeclarationHere, symbol.location);
        diag << sourceRange;
        return false;
    }

    if (context.flags.has(ASTFlags::NonProcedural)) {
        // chandles can only be assigned in procedural contexts.
        if (symbol.getType().isCHandle()) {
            context.addDiag(diag::AssignToCHandle, sourceRange);
            return false;
        }

        if (symbol.kind == SymbolKind::Net &&
            symbol.as<NetSymbol>().netType.netKind == NetType::UWire &&
            flags.has(AssignFlags::InOutPort)) {
            context.addDiag(diag::InOutUWireConn, sourceRange) << symbol.name;
            return false;
        }
    }
    else {
        // Nets can't be assigned in procedural contexts.
        if (symbol.kind == SymbolKind::Net) {
            context.addDiag(diag::AssignToNet, sourceRange);
            return false;
        }
    }

    if (VariableSymbol::isKind(symbol.kind)) {
        if (!checkVariableAssignment(context, symbol.as<VariableSymbol>(), flags, location,
                                     sourceRange)) {
            return false;
        }
    }
    else if (symbol.kind == SymbolKind::ModportPort) {
        if (symbol.as<ModportPortSymbol>().direction == ArgumentDirection::In) {
            auto& diag = context.addDiag(diag::InputPortAssign, sourceRange);
            diag << symbol.name;
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
            return false;
        }
    }

    if (!longestStaticPrefix)
        longestStaticPrefix = this;
    context.addDriver(symbol, *longestStaticPrefix, flags, customEvalContext);

    return true;
}